

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

ssize_t zip_entry_read(zip_t *zip,void **buf,size_t *bufsize)

{
  mz_uint file_index;
  mz_bool mVar1;
  void *pvVar2;
  size_t sVar3;
  size_t size;
  size_t local_30;
  
  local_30 = 0;
  sVar3 = 0xffffffffffffffff;
  if ((((zip != (zip_t *)0x0) && ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING)) &&
      (file_index = (zip->entry).index, -1 < (int)file_index)) &&
     (mVar1 = mz_zip_reader_is_file_a_directory(&zip->archive,file_index), mVar1 == 0)) {
    pvVar2 = mz_zip_reader_extract_to_heap(&zip->archive,file_index,&local_30,0);
    *buf = pvVar2;
    sVar3 = local_30;
    if (bufsize != (size_t *)0x0 && pvVar2 != (void *)0x0) {
      *bufsize = local_30;
    }
  }
  return sVar3;
}

Assistant:

ssize_t zip_entry_read(struct zip_t *zip, void **buf, size_t *bufsize) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  size_t size = 0;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return -1;
  }

  *buf = mz_zip_reader_extract_to_heap(pzip, idx, &size, 0);
  if (*buf && bufsize) {
    *bufsize = size;
  }
  return size;
}